

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cc
# Opt level: O2

void __thiscall muduo::Logger::Impl::finish(Impl *this)

{
  char *pcVar1;
  self *s;
  LogStream *pLVar2;
  char **ppcVar3;
  
  s = LogStream::operator<<(&this->stream_," - ");
  pLVar2 = operator<<(s,&this->basename_);
  pcVar1 = (pLVar2->buffer_).cur_;
  ppcVar3 = &(pLVar2->buffer_).cur_;
  if (((int)ppcVar3 - (int)pcVar1 & 0xfffffffeU) != 0) {
    *pcVar1 = ':';
    *ppcVar3 = *ppcVar3 + 1;
  }
  pLVar2 = LogStream::operator<<(pLVar2,this->line_);
  pcVar1 = (pLVar2->buffer_).cur_;
  ppcVar3 = &(pLVar2->buffer_).cur_;
  if (((int)ppcVar3 - (int)pcVar1 & 0xfffffffeU) != 0) {
    *pcVar1 = '\n';
    *ppcVar3 = *ppcVar3 + 1;
  }
  return;
}

Assistant:

void Logger::Impl::finish()
{
  stream_ << " - " << basename_ << ':' << line_ << '\n';
}